

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

ON_wString __thiscall ON_wString::DecodeXMLValue(ON_wString *this)

{
  uint uVar1;
  int iVar2;
  ON_Internal_Empty_wString *pOVar3;
  wchar_t *pwVar4;
  ulong uVar5;
  wchar_t wVar6;
  long lVar7;
  ON_wString *in_RSI;
  ON_wString OVar8;
  wchar_t *pwVar9;
  wchar_t *buffer;
  wchar_t *pwVar10;
  ON_wString *pOVar11;
  ON_wString s;
  uint u;
  wchar_t w [8];
  ON_wString local_78;
  uint local_6c;
  ON_wString *local_68;
  ON_wString *local_60;
  wchar_t local_58 [10];
  
  pwVar10 = in_RSI->m_s;
  pOVar3 = (ON_Internal_Empty_wString *)(pwVar10 + -3);
  if (pwVar10 == (wchar_t *)0x0) {
    pOVar3 = &empty_wstring;
  }
  uVar1 = (pOVar3->header).string_length;
  if ((((int)uVar1 < 1) || (pwVar10 == (wchar_t *)0x0)) || ((pOVar3->header).string_capacity < 1)) {
    local_60 = &EmptyString;
  }
  else {
    pwVar9 = pwVar10 + uVar1;
    lVar7 = 0;
    buffer = pwVar10;
    local_68 = this;
    local_60 = in_RSI;
    do {
      if ((*buffer == L'&') &&
         (pwVar4 = ParseXMLCharacterEncoding
                             (buffer,(int)((ulong)uVar1 * 4 + lVar7 >> 2),0,(uint *)0x0),
         pwVar4 != (wchar_t *)0x0)) {
        Duplicate(&local_78);
        pOVar11 = local_68;
        pOVar3 = (ON_Internal_Empty_wString *)(local_78.m_s + -3);
        if (local_78.m_s == (wchar_t *)0x0) {
          pOVar3 = &empty_wstring;
        }
        if ((pOVar3->header).string_length != uVar1) {
          ON_wString(local_68,&EmptyString);
          goto LAB_006747c2;
        }
        CopyArray(&local_78);
        pOVar11 = local_68;
        pOVar3 = (ON_Internal_Empty_wString *)(local_78.m_s + -3);
        if (local_78.m_s == (wchar_t *)0x0) {
          pOVar3 = &empty_wstring;
        }
        OVar8.m_s = (wchar_t *)0x0;
        if (0 < (pOVar3->header).string_capacity) {
          OVar8.m_s = local_78.m_s;
        }
        if (OVar8.m_s != pwVar10) {
          pwVar10 = OVar8.m_s - lVar7;
          if (buffer < pwVar9) goto LAB_006746d7;
          goto LAB_0067478f;
        }
        ON_wString(local_68,&EmptyString);
        goto LAB_006747c2;
      }
      buffer = buffer + 1;
      lVar7 = lVar7 + -4;
      this = local_68;
    } while (buffer < pwVar9);
  }
  ON_wString(this,local_60);
  return (ON_wString)(wchar_t *)this;
LAB_006746d7:
  wVar6 = *buffer;
  if (wVar6 == L'&') {
    local_6c = 0x110000;
    pwVar4 = ParseXMLCharacterEncoding
                       (buffer,(int)((ulong)((long)pwVar9 - (long)buffer) >> 2),0x110000,&local_6c);
    if (pwVar4 <= buffer) goto LAB_0067473b;
    local_58[4] = L'\0';
    local_58[5] = L'\0';
    local_58[6] = L'\0';
    local_58[7] = L'\0';
    local_58[0] = L'\0';
    local_58[1] = L'\0';
    local_58[2] = L'\0';
    local_58[3] = L'\0';
    iVar2 = ON_EncodeWideChar(local_6c,8,local_58);
    buffer = pwVar4;
    if (iVar2 < 1) goto LAB_0067473b;
    if (iVar2 == 1) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(iVar2 - 1);
      lVar7 = 0;
      do {
        *(undefined4 *)((long)pwVar10 + lVar7) = *(undefined4 *)((long)local_58 + lVar7);
        lVar7 = lVar7 + 4;
      } while (uVar5 * 4 - lVar7 != 0);
      pwVar10 = (wchar_t *)((long)pwVar10 + lVar7);
    }
    wVar6 = local_58[uVar5];
  }
  else {
LAB_0067473b:
    pwVar4 = buffer + 1;
  }
  *pwVar10 = wVar6;
  pwVar10 = pwVar10 + 1;
  buffer = pwVar4;
  if (pwVar9 <= pwVar4) {
LAB_0067478f:
    SetLength(&local_78,(long)pwVar10 - (long)OVar8.m_s >> 2);
    pOVar11 = local_68;
    ON_wString(local_68,&local_78);
LAB_006747c2:
    ~ON_wString(&local_78);
    return (ON_wString)(wchar_t *)pOVar11;
  }
  goto LAB_006746d7;
}

Assistant:

const ON_wString ON_wString::DecodeXMLValue() const
{
  const int length0 = this->Length();
  if (length0 <= 0)
    return ON_wString::EmptyString;

  const wchar_t* buffer0 = this->Array();
  if (nullptr == buffer0)
    return ON_wString::EmptyString;

  const wchar_t* buffer0_end = buffer0 + length0;
  for (const wchar_t* buffer1 = buffer0; buffer1 < buffer0_end; ++buffer1)
  {
    if (ON_wString::Ampersand != *buffer1)
      continue;
    if (nullptr == ON_wString::ParseXMLCharacterEncoding(buffer1, (int)(buffer0_end - buffer1), 0, nullptr))
      continue;

    // need to copy and modify.
    ON_wString s = this->Duplicate();
    if (s.Length() != length0)
      return ON_wString::EmptyString; // catastrophe!
    wchar_t* b0 = s.Array();
    if ( b0 == buffer0)
      return ON_wString::EmptyString; // catastrophe!

    // skip what we've already parsed
    wchar_t* b1 = b0 + (buffer1 - buffer0);

    // continue parsing and copying parsed results to s.
    for (wchar_t c = 0; buffer1 < buffer0_end; *b1++ = c)
    {
      c = *buffer1;
      if (ON_wString::Ampersand == c)
      {
        unsigned u = ON_UnicodeCodePoint::ON_InvalidCodePoint;
        const wchar_t* buffer2 = ON_wString::ParseXMLCharacterEncoding(buffer1, (int)(buffer0_end - buffer1), u, &u);
        if (buffer2 > buffer1)
        {
          buffer1 = buffer2;
          wchar_t w[8] = {};
          const int wcount = ON_EncodeWideChar(u, sizeof(w) / sizeof(w[0]), w);
          if (wcount >= 1)
          {
            for (int i = 0; i + 1 < wcount; ++i)
              *b1++ = w[i]; // UTF-16 or UTF-8 encoding
            c = w[wcount - 1];
            continue;
          }
        }
      }
      ++buffer1;
    }

    // s is the decoded version of this.
    s.SetLength(b1 - b0);
    return s;
  }

  // nothing to decode
  return *this;
}